

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tommytree.c
# Opt level: O3

tommy_tree_node * tommy_tree_balance(tommy_tree_node *root)

{
  uint uVar1;
  long lVar2;
  tommy_key_t tVar3;
  tommy_key_t tVar4;
  uint uVar5;
  tommy_tree_node *ptVar6;
  tommy_tree_node *ptVar7;
  tommy_tree_node *ptVar8;
  tommy_tree_node *prev;
  tommy_tree_node *next;
  long in_FS_OFFSET;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  do {
    ptVar7 = root->prev;
    tVar4 = 0;
    tVar3 = 0;
    if (ptVar7 != (tommy_tree_node *)0x0) {
      tVar3 = ptVar7->key;
    }
    ptVar6 = root->next;
    if (ptVar6 != (tommy_tree_node *)0x0) {
      tVar4 = ptVar6->key;
    }
    if ((int)(tVar3 - tVar4) < -1) {
      ptVar7 = ptVar6->prev;
      tVar4 = 0;
      tVar3 = 0;
      if (ptVar7 != (tommy_tree_node *)0x0) {
        tVar3 = ptVar7->key;
      }
      if (ptVar6->next != (tommy_node_struct *)0x0) {
        tVar4 = ptVar6->next->key;
      }
      if ((int)tVar4 < (int)tVar3) {
        ptVar6->prev = ptVar7->next;
        ptVar6 = tommy_tree_balance(ptVar6);
        ptVar7->next = ptVar6;
        ptVar6 = tommy_tree_balance(ptVar7);
        ptVar7 = ptVar6->prev;
      }
      root->next = ptVar7;
      ptVar7 = (tommy_tree_node *)&ptVar6->prev;
    }
    else {
      if ((int)(tVar3 - tVar4) < 2) {
        root->key = 0;
        uVar5 = 0;
        if (ptVar7 != (tommy_tree_node *)0x0) {
          tVar3 = ptVar7->key;
          if (tVar3 != 0) {
            root->key = tVar3;
            uVar5 = tVar3;
          }
        }
        if (ptVar6 != (tommy_tree_node *)0x0) {
          uVar1 = ptVar6->key;
          if (uVar5 < uVar1) {
            root->key = uVar1;
            uVar5 = uVar1;
          }
        }
        root->key = uVar5 + 1;
        if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
          return root;
        }
        __stack_chk_fail();
      }
      tVar4 = 0;
      tVar3 = 0;
      if (ptVar7->prev != (tommy_node_struct *)0x0) {
        tVar3 = ptVar7->prev->key;
      }
      ptVar8 = ptVar7->next;
      if (ptVar8 != (tommy_tree_node *)0x0) {
        tVar4 = ptVar8->key;
      }
      ptVar6 = ptVar7;
      if ((int)tVar3 < (int)tVar4) {
        ptVar7->next = ptVar8->prev;
        ptVar7 = tommy_tree_balance(ptVar7);
        ptVar8->prev = ptVar7;
        ptVar6 = tommy_tree_balance(ptVar8);
        ptVar8 = ptVar6->next;
      }
      root->prev = ptVar8;
      ptVar7 = ptVar6;
    }
    ptVar8 = tommy_tree_balance(root);
    ptVar7->next = ptVar8;
    root = ptVar6;
  } while( true );
}

Assistant:

static tommy_tree_node* tommy_tree_balance(tommy_tree_node* root)
{
	int delta = tommy_tree_delta(root);

	if (delta < -1) {
		if (tommy_tree_delta(root->next) > 0)
			root->next = tommy_tree_rotate_right(root->next);
		return tommy_tree_rotate_left(root);
	}

	if (delta > 1) {
		if (tommy_tree_delta(root->prev) < 0)
			root->prev = tommy_tree_rotate_left(root->prev);
		return tommy_tree_rotate_right(root);
	}

	/* recompute key */
	root->key = 0;

	if (root->prev && root->prev->key > root->key)
		root->key = root->prev->key;

	if (root->next && root->next->key > root->key)
		root->key = root->next->key;

	/* count itself */
	root->key += 1;

	return root;
}